

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitLoad(I64ToI32Lowering *this,Load *curr)

{
  uint align;
  LocalSet *args;
  LocalSet *any;
  bool bVar1;
  Index IVar2;
  Index IVar3;
  pointer pBVar4;
  pointer pBVar5;
  address64_t aVar6;
  uint *puVar7;
  pointer pBVar8;
  LocalGet *pLVar9;
  Load *value;
  Const *pCVar10;
  Binary *value_00;
  uchar *puVar11;
  LocalSet *append;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_00;
  Type local_120;
  Block *local_118;
  Block *result;
  uint local_104;
  uint local_100;
  uchar local_f9;
  Type local_f8;
  Type local_f0;
  size_t local_e8;
  char *pcStack_e0;
  Type local_d8;
  Type local_d0;
  uint local_c8;
  uint local_c4;
  Address local_c0;
  LocalSet *local_b8;
  LocalSet *loadHigh;
  LocalSet *setPtr;
  undefined1 local_a0 [8];
  TempVar ptrTemp;
  Type local_70;
  undefined1 local_68 [8];
  TempVar highBits;
  undefined1 local_40 [8];
  TempVar lowBits;
  Load *curr_local;
  I64ToI32Lowering *this_local;
  
  lowBits.ty.id._4_4_ = 3;
  bVar1 = wasm::Type::operator!=
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type,(BasicType *)((long)&lowBits.ty.id + 4));
  if (!bVar1) {
    if ((curr->isAtomic & 1U) != 0) {
      __assert_fail("!curr->isAtomic && \"64-bit atomic load not implemented\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x17b,"void wasm::I64ToI32Lowering::visitLoad(Load *)");
    }
    wasm::Type::Type(&highBits.ty,i32);
    getTemp((TempVar *)local_40,this,highBits.ty);
    wasm::Type::Type(&local_70,i32);
    getTemp((TempVar *)local_68,this,local_70);
    wasm::Type::Type((Type *)&setPtr,i32);
    getTemp((TempVar *)local_a0,this,(Type)setPtr);
    pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a0);
    loadHigh = Builder::makeLocalSet(pBVar4,IVar2,curr->ptr);
    if (curr->bytes == '\b') {
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
      pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      bVar1 = curr->signed_;
      aVar6 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
      wasm::Address::Address(&local_c0,aVar6 + 4);
      aVar6 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
      local_c4 = (uint)aVar6;
      local_c8 = 4;
      puVar7 = std::min<unsigned_int>(&local_c4,&local_c8);
      align = *puVar7;
      pBVar8 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a0);
      wasm::Type::Type(&local_d0,i32);
      pLVar9 = Builder::makeLocalGet(pBVar8,IVar3,local_d0);
      wasm::Type::Type(&local_d8,i32);
      local_e8 = (curr->memory).super_IString.str._M_len;
      pcStack_e0 = (curr->memory).super_IString.str._M_str;
      value = Builder::makeLoad(pBVar5,4,(bool)(bVar1 & 1),local_c0,align,(Expression *)pLVar9,
                                local_d8,(Name)(curr->memory).super_IString.str);
      local_b8 = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)value);
    }
    else if ((curr->signed_ & 1U) == 0) {
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
      pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      pCVar10 = Builder::makeConst<int>(pBVar5,0);
      local_b8 = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)pCVar10);
    }
    else {
      this_00 = &this->builder;
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (this_00);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
      pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (this_00);
      pBVar8 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (this_00);
      IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_40);
      wasm::Type::Type(&local_f0,i32);
      pLVar9 = Builder::makeLocalGet(pBVar8,IVar3,local_f0);
      pBVar8 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      pCVar10 = Builder::makeConst<int>(pBVar8,0x1f);
      value_00 = Builder::makeBinary(pBVar5,ShrSInt32,(Expression *)pLVar9,(Expression *)pCVar10);
      local_b8 = Builder::makeLocalSet(pBVar4,IVar2,(Expression *)value_00);
    }
    wasm::Type::Type(&local_f8,i32);
    (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id =
         local_f8.id;
    local_f9 = '\x04';
    puVar11 = std::min<unsigned_char>(&curr->bytes,&local_f9);
    curr->bytes = *puVar11;
    aVar6 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
    local_100 = (uint)aVar6;
    local_104 = 4;
    puVar7 = std::min<unsigned_int>(&local_100,&local_104);
    wasm::Address::operator=(&curr->align,(ulong)*puVar7);
    pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_a0);
    wasm::Type::Type((Type *)&result,i32);
    pLVar9 = Builder::makeLocalGet(pBVar4,IVar2,(Type)result);
    curr->ptr = (Expression *)pLVar9;
    pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    any = loadHigh;
    pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_40);
    append = Builder::makeLocalSet(pBVar5,IVar2,(Expression *)curr);
    args = local_b8;
    pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_40);
    wasm::Type::Type(&local_120,i32);
    pLVar9 = Builder::makeLocalGet(pBVar5,IVar2,local_120);
    local_118 = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                          (pBVar4,(Expression *)any,(Expression *)append,args,pLVar9);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)local_118);
    setOutParam(this,(Expression *)local_118,(TempVar *)local_68);
    TempVar::~TempVar((TempVar *)local_a0);
    TempVar::~TempVar((TempVar *)local_68);
    TempVar::~TempVar((TempVar *)local_40);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
    if (curr->type != Type::i64) {
      return;
    }
    assert(!curr->isAtomic && "64-bit atomic load not implemented");
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    TempVar ptrTemp = getTemp();
    LocalSet* setPtr = builder->makeLocalSet(ptrTemp, curr->ptr);
    LocalSet* loadHigh;
    if (curr->bytes == 8) {
      loadHigh = builder->makeLocalSet(
        highBits,
        builder->makeLoad(4,
                          curr->signed_,
                          curr->offset + 4,
                          std::min(uint32_t(curr->align), uint32_t(4)),
                          builder->makeLocalGet(ptrTemp, Type::i32),
                          Type::i32,
                          curr->memory));
    } else if (curr->signed_) {
      loadHigh = builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(lowBits, Type::i32),
                            builder->makeConst(int32_t(31))));
    } else {
      loadHigh =
        builder->makeLocalSet(highBits, builder->makeConst(int32_t(0)));
    }
    curr->type = Type::i32;
    curr->bytes = std::min(curr->bytes, uint8_t(4));
    curr->align = std::min(uint32_t(curr->align), uint32_t(4));
    curr->ptr = builder->makeLocalGet(ptrTemp, Type::i32);
    Block* result =
      builder->blockify(setPtr,
                        builder->makeLocalSet(lowBits, curr),
                        loadHigh,
                        builder->makeLocalGet(lowBits, Type::i32));
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }